

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::
PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::MonomorphicImpl<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::~MonomorphicImpl
          (MonomorphicImpl<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this)

{
  MonomorphicImpl<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this_local;
  
  (this->super_MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MonomorphicImpl_029bbe10;
  internal::
  HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~HasSubstrMatcher(&this->impl_);
  MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::~MatcherInterface
            (&this->
              super_MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>)
  ;
  return;
}

Assistant:

explicit MonomorphicImpl(const Impl& impl) : impl_(impl) {}